

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildSetupFont
               (ImFontAtlas *atlas,ImFont *font,ImFontConfig *font_config,float ascent,float descent
               )

{
  if (font_config->MergeMode == false) {
    ImFont::ClearOutputData(font);
    font->FontSize = font_config->SizePixels;
    font->ContainerAtlas = atlas;
    font->Ascent = ascent;
    font->Descent = descent;
  }
  return;
}

Assistant:

void ImFontAtlasBuildSetupFont(ImFontAtlas* atlas, ImFont* font, ImFontConfig* font_config, float ascent, float descent)
{
    if (!font_config->MergeMode)
    {
        font->ClearOutputData();
        font->FontSize = font_config->SizePixels;
        IM_ASSERT(font->ConfigData == font_config);
        font->ContainerAtlas = atlas;
        font->Ascent = ascent;
        font->Descent = descent;
    }
}